

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerWrapCase::test
          (SamplerWrapCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  bool bVar1;
  deBool dVar2;
  TestLog *pTVar3;
  Enum<int,_2UL> EVar4;
  bool local_439;
  GetNameFunc local_428;
  int local_420;
  string local_418;
  allocator<char> local_3f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  GLenum local_370;
  int local_36c;
  deUint32 err_3;
  int ndx_2;
  int local_360;
  GetNameFunc local_358;
  int local_350;
  string local_348;
  allocator<char> local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  GLenum local_2a0;
  int local_29c;
  deUint32 err_2;
  int ndx_1;
  int local_290;
  GetNameFunc local_288;
  int local_280;
  string local_278;
  allocator<char> local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  GLenum local_1d0;
  GLuint local_1cc;
  deUint32 err_1;
  GLuint value_1;
  int local_1c0;
  GetNameFunc local_1b8;
  int local_1b0;
  string local_1a8;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  GLenum local_fc;
  GLint local_f8;
  deUint32 err;
  GLint value;
  int ndx;
  GLenum wrapValues [3];
  allocator<char> local_b9;
  string local_b8;
  ScopedLogSection local_98;
  ScopedLogSection section_1;
  string local_88;
  allocator<char> local_51;
  string local_50;
  ScopedLogSection local_30;
  ScopedLogSection section;
  bool isPureCase;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  SamplerWrapCase *this_local;
  
  bVar1 = isPureIntTester((this->super_SamplerTest).m_tester);
  local_439 = true;
  if (!bVar1) {
    local_439 = isPureUintTester((this->super_SamplerTest).m_tester);
  }
  section.m_log._7_1_ = local_439;
  if (local_439 == false) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Initial",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Initial",(allocator<char> *)((long)&section_1.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_30,pTVar3,&local_50,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x2901
               ,(this->super_SamplerTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&local_30);
  }
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Set",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(wrapValues + 2),"Set",(allocator<char> *)((long)wrapValues + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_98,pTVar3,&local_b8,(string *)(wrapValues + 2));
  std::__cxx11::string::~string((string *)(wrapValues + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)wrapValues + 7));
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  _value = 0x29010000812f;
  wrapValues[0] = 0x8370;
  if ((section.m_log._7_1_ & 1) == 0) {
    for (local_29c = 0; local_29c < 3; local_29c = local_29c + 1) {
      glu::CallLogWrapper::glSamplerParameteri
                (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 (&value)[local_29c]);
      do {
        local_2a0 = glu::CallLogWrapper::glGetError(gl);
        if (local_2a0 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_320,"Got Error ",&local_321);
          EVar4 = glu::getErrorStr(local_2a0);
          _err_3 = EVar4.m_getName;
          local_360 = EVar4.m_value;
          local_358 = _err_3;
          local_350 = local_360;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_348,&local_358);
          std::operator+(&local_300,&local_320,&local_348);
          std::operator+(&local_2e0,&local_300,": ");
          std::operator+(&local_2c0,&local_2e0,"glSamplerParameteri");
          tcu::ResultCollector::fail(result,&local_2c0);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::__cxx11::string::~string((string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)&local_348);
          std::__cxx11::string::~string((string *)&local_320);
          std::allocator<char>::~allocator(&local_321);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      StateQueryUtil::verifyStateSamplerParamInteger
                (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 (&value)[local_29c],(this->super_SamplerTest).m_type);
    }
    for (local_36c = 0; local_36c < 3; local_36c = local_36c + 1) {
      glu::CallLogWrapper::glSamplerParameterf
                (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 (float)(uint)(&value)[local_36c]);
      do {
        local_370 = glu::CallLogWrapper::glGetError(gl);
        if (local_370 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3f0,"Got Error ",&local_3f1);
          EVar4 = glu::getErrorStr(local_370);
          local_428 = EVar4.m_getName;
          local_420 = EVar4.m_value;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_418,&local_428);
          std::operator+(&local_3d0,&local_3f0,&local_418);
          std::operator+(&local_3b0,&local_3d0,": ");
          std::operator+(&local_390,&local_3b0,"glSamplerParameterf");
          tcu::ResultCollector::fail(result,&local_390);
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::string::~string((string *)&local_3b0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::allocator<char>::~allocator(&local_3f1);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      StateQueryUtil::verifyStateSamplerParamInteger
                (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 (&value)[local_36c],(this->super_SamplerTest).m_type);
    }
  }
  else {
    for (err = 0; (int)err < 3; err = err + 1) {
      bVar1 = isPureIntTester((this->super_SamplerTest).m_tester);
      if (bVar1) {
        local_f8 = (&value)[(int)err];
        glu::CallLogWrapper::glSamplerParameterIiv
                  (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,&local_f8
                  );
        do {
          local_fc = glu::CallLogWrapper::glGetError(gl);
          if (local_fc != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_180,"Got Error ",&local_181);
            EVar4 = glu::getErrorStr(local_fc);
            _err_1 = EVar4.m_getName;
            local_1c0 = EVar4.m_value;
            local_1b8 = _err_1;
            local_1b0 = local_1c0;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1a8,&local_1b8);
            std::operator+(&local_160,&local_180,&local_1a8);
            std::operator+(&local_140,&local_160,": ");
            std::operator+(&local_120,&local_140,"glSamplerParameterIiv");
            tcu::ResultCollector::fail(result,&local_120);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string((string *)&local_140);
            std::__cxx11::string::~string((string *)&local_160);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_180);
            std::allocator<char>::~allocator(&local_181);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
      }
      else {
        local_1cc = (&value)[(int)err];
        glu::CallLogWrapper::glSamplerParameterIuiv
                  (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                   &local_1cc);
        do {
          local_1d0 = glu::CallLogWrapper::glGetError(gl);
          if (local_1d0 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_250,"Got Error ",&local_251);
            EVar4 = glu::getErrorStr(local_1d0);
            _err_2 = EVar4.m_getName;
            local_290 = EVar4.m_value;
            local_288 = _err_2;
            local_280 = local_290;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_278,&local_288);
            std::operator+(&local_230,&local_250,&local_278);
            std::operator+(&local_210,&local_230,": ");
            std::operator+(&local_1f0,&local_210,"glSamplerParameterIuiv");
            tcu::ResultCollector::fail(result,&local_1f0);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::__cxx11::string::~string((string *)&local_210);
            std::__cxx11::string::~string((string *)&local_230);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string((string *)&local_250);
            std::allocator<char>::~allocator(&local_251);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
      }
      StateQueryUtil::verifyStateSamplerParamInteger
                (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 (&value)[(int)err],(this->super_SamplerTest).m_type);
    }
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_98);
  return;
}

Assistant:

void SamplerWrapCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool isPureCase = isPureIntTester(m_tester) || isPureUintTester(m_tester);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_REPEAT, m_type);
	}

	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const GLenum				wrapValues[]	= {GL_CLAMP_TO_EDGE, GL_REPEAT, GL_MIRRORED_REPEAT};

		if (isPureCase)
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(wrapValues); ++ndx)
			{
				if (isPureIntTester(m_tester))
				{
					const glw::GLint value = (glw::GLint)wrapValues[ndx];
					gl.glSamplerParameterIiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIiv");
				}
				else
				{
					DE_ASSERT(isPureUintTester(m_tester));

					const glw::GLuint value = wrapValues[ndx];
					gl.glSamplerParameterIuiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIuiv");
				}

				verifyStateSamplerParamInteger(result, gl, m_target, m_pname, wrapValues[ndx], m_type);
			}
		}
		else
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(wrapValues); ++ndx)
			{
				gl.glSamplerParameteri(m_target, m_pname, wrapValues[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameteri");

				verifyStateSamplerParamInteger(result, gl, m_target, m_pname, wrapValues[ndx], m_type);
			}

			//check unit conversions with float

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(wrapValues); ++ndx)
			{
				gl.glSamplerParameterf(m_target, m_pname, (GLfloat)wrapValues[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterf");

				verifyStateSamplerParamInteger(result, gl, m_target, m_pname, wrapValues[ndx], m_type);
			}
		}
	}
}